

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumConstantOptions
          (Parser *this,EnumValueDescriptorProto *value,LocationRecorder *enum_value_location,
          FileDescriptorProto *containing_file)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  EnumValueOptions *pEVar4;
  Arena *arena;
  LocationRecorder location;
  LocationRecorder LStack_48;
  
  iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  bVar2 = true;
  if (iVar3 == 0) {
    LocationRecorder::LocationRecorder(&LStack_48,enum_value_location,3);
    bVar2 = Consume(this,"[");
    if (bVar2) {
      do {
        *(byte *)(value->_has_bits_).has_bits_ = (byte)(value->_has_bits_).has_bits_[0] | 2;
        if (value->options_ == (EnumValueOptions *)0x0) {
          uVar1 = (value->super_Message).super_MessageLite._internal_metadata_.ptr_;
          arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
          if ((uVar1 & 1) != 0) {
            arena = *(Arena **)arena;
          }
          pEVar4 = Arena::CreateMaybeMessage<google::protobuf::EnumValueOptions>(arena);
          value->options_ = pEVar4;
        }
        bVar2 = ParseOption(this,&value->options_->super_Message,&LStack_48,containing_file,
                            OPTION_ASSIGNMENT);
        if (!bVar2) goto LAB_003468e4;
        bVar2 = TryConsume(this,",");
      } while (bVar2);
      bVar2 = Consume(this,"]");
    }
    else {
LAB_003468e4:
      bVar2 = false;
    }
    LocationRecorder::~LocationRecorder(&LStack_48);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseEnumConstantOptions(
    EnumValueDescriptorProto* value,
    const LocationRecorder& enum_value_location,
    const FileDescriptorProto* containing_file) {
  if (!LookingAt("[")) return true;

  LocationRecorder location(enum_value_location,
                            EnumValueDescriptorProto::kOptionsFieldNumber);

  DO(Consume("["));

  do {
    DO(ParseOption(value->mutable_options(), location, containing_file,
                   OPTION_ASSIGNMENT));
  } while (TryConsume(","));

  DO(Consume("]"));
  return true;
}